

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O3

void __thiscall
ylt::metric::basic_static_histogram<long>::basic_static_histogram
          (basic_static_histogram<long> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *buckets,size_t dupli_count)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pdVar2;
  undefined1 local_71;
  size_t local_70;
  string local_68;
  string local_48;
  
  local_68._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (help->_M_dataplus)._M_p;
  paVar1 = &help->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&help->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_string_length = help->_M_string_length;
  (help->_M_dataplus)._M_p = (pointer)paVar1;
  help->_M_string_length = 0;
  (help->field_2)._M_local_buf[0] = '\0';
  local_70 = dupli_count;
  metric_t::metric_t((metric_t *)this,Histogram,&local_68,&local_48);
  (this->super_static_metric).super_metric_t._vptr_metric_t = (_func_int **)&PTR__metric_t_001fdc68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (this->super_static_metric).super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__basic_static_histogram_001fe080;
  pdVar2 = (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar2;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sum_).super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ylt::metric::basic_static_gauge<long>,std::allocator<ylt::metric::basic_static_gauge<long>>,char_const(&)[1],char_const(&)[1],unsigned_long&>
            (&(this->sum_).
              super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(basic_static_gauge<long> **)&this->sum_,
             (allocator<ylt::metric::basic_static_gauge<long>_> *)&local_71,(char (*) [1])0x1a674c,
             (char (*) [1])0x1a674c,&local_70);
  init_bucket_counter(this,local_70,
                      (long)(this->bucket_boundaries_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->bucket_boundaries_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

basic_static_histogram(std::string name, std::string help,
                         std::vector<double> buckets, size_t dupli_count = 2)
      : bucket_boundaries_(std::move(buckets)),
        static_metric(MetricType::Histogram, std::move(name), std::move(help)),
        sum_(std::make_shared<gauge_t>("", "", dupli_count)) {
    init_bucket_counter(dupli_count, bucket_boundaries_.size());
  }